

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O0

void __thiscall wallet::wallet_tests::importmulti_rescan::test_method(importmulti_rescan *this)

{
  initializer_list<int> __l;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  bool bVar1;
  FlatFilePos FVar2;
  int64_t iVar3;
  long in_RDI;
  long in_FS_OFFSET;
  int file_number;
  CKey futureKey;
  WalletContext context;
  shared_ptr<wallet::CWallet> wallet;
  CBlockIndex *newTip;
  CBlockIndex *oldTip;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock30;
  UniValue response;
  JSONRPCRequest request;
  UniValue key;
  UniValue keys;
  char *in_stack_fffffffffffff398;
  CBlockIndex *in_stack_fffffffffffff3a0;
  char *in_stack_fffffffffffff3a8;
  UniValue *in_stack_fffffffffffff3b0;
  undefined4 in_stack_fffffffffffff3b8;
  int in_stack_fffffffffffff3bc;
  JSONRPCRequest *in_stack_fffffffffffff3c0;
  UniValue *in_stack_fffffffffffff3c8;
  UniValue *in_stack_fffffffffffff3d0;
  const_string *file;
  Chainstate *in_stack_fffffffffffff3d8;
  unit_test_log_t *this_00;
  BlockManager *in_stack_fffffffffffff3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3e8;
  undefined1 *puVar4;
  _Optional_base<bool,_true,_true> load_on_start;
  TestChain100Setup *in_stack_fffffffffffff3f0;
  CWallet *in_stack_fffffffffffff3f8;
  iterator in_stack_fffffffffffff400;
  size_type in_stack_fffffffffffff408;
  BlockManager *in_stack_fffffffffffff418;
  allocator<char> *paVar5;
  undefined8 *puVar6;
  int local_b88;
  int in_stack_fffffffffffff48c;
  optional<bool> local_b62;
  JSONRPCRequest *in_stack_fffffffffffff4a0;
  undefined4 in_stack_fffffffffffff4a8;
  undefined4 in_stack_fffffffffffff4ac;
  undefined1 local_b50 [16];
  undefined1 local_b40 [64];
  undefined1 *local_b00;
  undefined1 local_af2;
  allocator<char> local_af1;
  long local_af0;
  allocator<char> local_ae1 [24];
  allocator<char> local_ac9 [23];
  undefined1 local_ab2;
  allocator<char> local_ab1;
  undefined4 local_ab0;
  allocator<char> local_aa9 [24];
  allocator<char> local_a91;
  undefined1 local_a90 [16];
  long local_a80;
  undefined1 *local_a20;
  CBlockIndex **local_a18;
  pointer local_a08;
  undefined1 local_a00 [32];
  CBlockIndex *local_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  CBlockIndex **local_9b8;
  CBlockIndex *local_9a8;
  int local_99c;
  undefined1 local_988 [248];
  undefined1 local_890 [304];
  unit_test_log_t local_760 [27];
  undefined1 local_688 [1344];
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff3d8,(char *)in_stack_fffffffffffff3d0,
             (int)((ulong)in_stack_fffffffffffff3c8 >> 0x20),(char *)in_stack_fffffffffffff3c0,
             (char *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff398);
  ChainstateManager::GetMutex((ChainstateManager *)in_stack_fffffffffffff398);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff398);
  local_9a8 = test_method::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffff3d8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff398);
  local_9b8 = &local_9a8;
  test_method::anon_class_16_2_4c6564ef::operator()
            ((anon_class_16_2_4c6564ef *)in_stack_fffffffffffff3d8);
  local_9d8 = 0;
  uStack_9d0 = 0;
  local_9c8 = 0;
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_fffffffffffff398);
  CKey::GetPubKey((CKey *)in_stack_fffffffffffff3c0);
  GetScriptForRawPubKey((CPubKey *)in_stack_fffffffffffff3e0);
  TestChain100Setup::CreateAndProcessBlock
            (in_stack_fffffffffffff3f0,
             (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_fffffffffffff3e8,(CScript *)in_stack_fffffffffffff3e0,
             in_stack_fffffffffffff3d8);
  CBlock::~CBlock((CBlock *)in_stack_fffffffffffff398);
  CScript::~CScript((CScript *)in_stack_fffffffffffff398);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_fffffffffffff3a8);
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff3d8,(char *)in_stack_fffffffffffff3d0,
             (int)((ulong)in_stack_fffffffffffff3c8 >> 0x20),(char *)in_stack_fffffffffffff3c0,
             (char *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff398);
  ChainstateManager::GetMutex((ChainstateManager *)in_stack_fffffffffffff398);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff398);
  local_9e0 = test_method::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffff3d8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff398);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff3d8,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff3d0,
             (char *)in_stack_fffffffffffff3c8,(char *)in_stack_fffffffffffff3c0,
             in_stack_fffffffffffff3bc,SUB41((uint)in_stack_fffffffffffff3b8 >> 0x18,0));
  FVar2 = CBlockIndex::GetBlockPos(in_stack_fffffffffffff3a0);
  local_b88 = FVar2.nFile;
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff3d8,(char *)in_stack_fffffffffffff3d0,
             (int)((ulong)in_stack_fffffffffffff3c8 >> 0x20),(char *)in_stack_fffffffffffff3c0,
             (char *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff398);
  ::node::BlockManager::PruneOneBlockFile(in_stack_fffffffffffff418,in_stack_fffffffffffff48c);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff398);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff398);
  local_99c = local_b88;
  std::allocator<int>::allocator((allocator<int> *)in_stack_fffffffffffff398);
  __l._M_len = in_stack_fffffffffffff408;
  __l._M_array = in_stack_fffffffffffff400;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff3f0,__l,
             (less<int> *)in_stack_fffffffffffff3e8,(allocator_type *)in_stack_fffffffffffff3e0);
  ::node::BlockManager::UnlinkPrunedFiles
            (in_stack_fffffffffffff3e0,
             (set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff3d8);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff398);
  std::allocator<int>::~allocator((allocator<int> *)in_stack_fffffffffffff398);
  local_a08 = std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::get
                        ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                         in_stack_fffffffffffff398);
  local_128 = 0;
  uStack_120 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_148 = 0;
  uStack_140 = 0;
  puVar6 = &local_148;
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
         *)in_stack_fffffffffffff398);
  CreateMockableWalletDatabase((MockableData *)in_stack_fffffffffffff3a8);
  std::
  make_shared<wallet::CWallet,interfaces::Chain*,char_const(&)[1],std::unique_ptr<wallet::WalletDatabase,std::default_delete<wallet::WalletDatabase>>>
            ((Chain **)in_stack_fffffffffffff3d8,(char (*) [1])in_stack_fffffffffffff3d0,
             (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             in_stack_fffffffffffff3c8);
  std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::~unique_ptr
            ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             in_stack_fffffffffffff3a8);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
          *)in_stack_fffffffffffff398);
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffff398);
  CWallet::SetupLegacyScriptPubKeyMan(in_stack_fffffffffffff3f8);
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffff398);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff398);
  local_a20 = local_a00;
  local_a18 = &local_9e0;
  test_method::anon_class_16_2_67b3749b::operator()
            ((anon_class_16_2_67b3749b *)in_stack_fffffffffffff3d8);
  WalletContext::WalletContext((WalletContext *)in_stack_fffffffffffff398);
  local_a80 = in_RDI + 0x1f0;
  AddWallet((WalletContext *)in_stack_fffffffffffff3d8,
            (shared_ptr<wallet::CWallet> *)in_stack_fffffffffffff3d0);
  UniValue::UniValue((UniValue *)in_stack_fffffffffffff398);
  UniValue::setArray((UniValue *)in_stack_fffffffffffff398);
  UniValue::UniValue((UniValue *)in_stack_fffffffffffff398);
  UniValue::setObject((UniValue *)in_stack_fffffffffffff398);
  paVar5 = &local_a91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  CKey::GetPubKey((CKey *)in_stack_fffffffffffff3c0);
  GetScriptForRawPubKey((CPubKey *)in_stack_fffffffffffff3e0);
  Span<const_unsigned_char>::Span<CScript>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffff3a8,
             (CScript *)in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
  s.m_size = (size_t)puVar6;
  s.m_data = (uchar *)paVar5;
  HexStr_abi_cxx11_(s);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ((UniValue *)in_stack_fffffffffffff3d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3d0);
  UniValue::pushKV((UniValue *)in_stack_fffffffffffff3e0,(string *)in_stack_fffffffffffff3d8,
                   in_stack_fffffffffffff3d0);
  UniValue::~UniValue((UniValue *)in_stack_fffffffffffff398);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff398);
  CScript::~CScript((CScript *)in_stack_fffffffffffff398);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff398);
  std::allocator<char>::~allocator(&local_a91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  local_ab0 = 0;
  UniValue::UniValue<int,_int,_true>
            ((UniValue *)in_stack_fffffffffffff3d8,(int *)in_stack_fffffffffffff3d0);
  UniValue::pushKV((UniValue *)in_stack_fffffffffffff3e0,(string *)in_stack_fffffffffffff3d8,
                   in_stack_fffffffffffff3d0);
  UniValue::~UniValue((UniValue *)in_stack_fffffffffffff398);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff398);
  std::allocator<char>::~allocator(local_aa9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  local_ab2 = 1;
  UniValue::UniValue<bool,_bool,_true>
            ((UniValue *)in_stack_fffffffffffff3d8,(bool *)in_stack_fffffffffffff3d0);
  UniValue::pushKV((UniValue *)in_stack_fffffffffffff3e0,(string *)in_stack_fffffffffffff3d8,
                   in_stack_fffffffffffff3d0);
  UniValue::~UniValue((UniValue *)in_stack_fffffffffffff398);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff398);
  std::allocator<char>::~allocator(&local_ab1);
  UniValue::UniValue(in_stack_fffffffffffff3c8,(UniValue *)in_stack_fffffffffffff3c0);
  UniValue::push_back(in_stack_fffffffffffff3b0,(UniValue *)in_stack_fffffffffffff3a8);
  UniValue::~UniValue((UniValue *)in_stack_fffffffffffff398);
  UniValue::clear((UniValue *)in_stack_fffffffffffff398);
  UniValue::setObject((UniValue *)in_stack_fffffffffffff398);
  GenerateRandomKey(SUB81((ulong)in_stack_fffffffffffff3a0 >> 0x38,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  CKey::GetPubKey((CKey *)in_stack_fffffffffffff3c0);
  GetScriptForRawPubKey((CPubKey *)in_stack_fffffffffffff3e0);
  Span<const_unsigned_char>::Span<CScript>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffff3a8,
             (CScript *)in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
  s_00.m_size = (size_t)puVar6;
  s_00.m_data = (uchar *)paVar5;
  HexStr_abi_cxx11_(s_00);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ((UniValue *)in_stack_fffffffffffff3d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3d0);
  UniValue::pushKV((UniValue *)in_stack_fffffffffffff3e0,(string *)in_stack_fffffffffffff3d8,
                   in_stack_fffffffffffff3d0);
  UniValue::~UniValue((UniValue *)in_stack_fffffffffffff398);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff398);
  CScript::~CScript((CScript *)in_stack_fffffffffffff398);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff398);
  std::allocator<char>::~allocator(local_ac9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  iVar3 = CBlockIndex::GetBlockTimeMax((CBlockIndex *)in_stack_fffffffffffff398);
  local_af0 = iVar3 + 0x1c21;
  UniValue::UniValue<long,_long,_true>
            ((UniValue *)in_stack_fffffffffffff3d8,(long *)in_stack_fffffffffffff3d0);
  UniValue::pushKV((UniValue *)in_stack_fffffffffffff3e0,(string *)in_stack_fffffffffffff3d8,
                   in_stack_fffffffffffff3d0);
  UniValue::~UniValue((UniValue *)in_stack_fffffffffffff398);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff398);
  std::allocator<char>::~allocator(local_ae1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  local_af2 = 1;
  UniValue::UniValue<bool,_bool,_true>
            ((UniValue *)in_stack_fffffffffffff3d8,(bool *)in_stack_fffffffffffff3d0);
  UniValue::pushKV((UniValue *)in_stack_fffffffffffff3e0,(string *)in_stack_fffffffffffff3d8,
                   in_stack_fffffffffffff3d0);
  UniValue::~UniValue((UniValue *)in_stack_fffffffffffff398);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff398);
  std::allocator<char>::~allocator(&local_af1);
  puVar4 = local_688;
  UniValue::UniValue((UniValue *)in_stack_fffffffffffff3a8,(UniValue *)in_stack_fffffffffffff3a0);
  UniValue::push_back(in_stack_fffffffffffff3b0,(UniValue *)in_stack_fffffffffffff3a8);
  UniValue::~UniValue((UniValue *)in_stack_fffffffffffff398);
  JSONRPCRequest::JSONRPCRequest(in_stack_fffffffffffff3c0);
  local_b00 = local_a90;
  std::any::operator=((any *)in_stack_fffffffffffff3a8,(WalletContext **)in_stack_fffffffffffff3a0);
  UniValue::setArray((UniValue *)in_stack_fffffffffffff398);
  this_00 = local_760;
  UniValue::UniValue((UniValue *)in_stack_fffffffffffff3a8,(UniValue *)in_stack_fffffffffffff3a0);
  UniValue::push_back(in_stack_fffffffffffff3b0,(UniValue *)in_stack_fffffffffffff3a8);
  UniValue::~UniValue((UniValue *)in_stack_fffffffffffff398);
  importmulti();
  RPCHelpMan::HandleRequest
            ((RPCHelpMan *)CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8),
             in_stack_fffffffffffff4a0);
  RPCHelpMan::~RPCHelpMan((RPCHelpMan *)in_stack_fffffffffffff398);
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3a8,
               (pointer)in_stack_fffffffffffff3a0,(unsigned_long)in_stack_fffffffffffff398);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff398);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,file,(size_t)in_stack_fffffffffffff3c8,
               (const_string *)in_stack_fffffffffffff3c0);
    in_stack_fffffffffffff3c8 = (UniValue *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff3a0,(char (*) [1])in_stack_fffffffffffff398);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3a8,
               (pointer)in_stack_fffffffffffff3a0,(unsigned_long)in_stack_fffffffffffff398);
    UniValue::write_abi_cxx11_((UniValue *)(local_988 + 0x20),(int)local_890,(void *)0x0,0);
    in_stack_fffffffffffff3c0 =
         (JSONRPCRequest *)CBlockIndex::GetBlockTimeMax((CBlockIndex *)in_stack_fffffffffffff398);
    tinyformat::format<int,long,long>
              ((char *)this_00,(int *)file,(long *)in_stack_fffffffffffff3c8,
               (long *)in_stack_fffffffffffff3c0);
    in_stack_fffffffffffff3a8 =
         "tfm::format(\"[{\\\"success\\\":false,\\\"error\\\":{\\\"code\\\":-1,\\\"message\\\":\\\"Rescan failed for key with creation \" \"timestamp %d. There was an error reading a block from time %d, which is after or within %d \" \"seconds of key creation, and could contain transactions pertaining to the key. As a result, \" \"transactions and coins using this key may not appear in the wallet. This error could be caused \" \"by pruning or data corruption (see bitcoind log for details) and could be dealt with by \" \"downloading and rescanning the relevant blocks (see -reindex option and rescanblockchain \" \"RPC).\\\"}},{\\\"success\\\":true}]\", 0, oldTip->GetBlockTimeMax(), TIMESTAMP_WINDOW)"
    ;
    in_stack_fffffffffffff3a0 = (CBlockIndex *)local_988;
    in_stack_fffffffffffff398 = "response.write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_b40,local_b50,0xfe,1,2,local_988 + 0x20);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff398);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff398);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff398);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
    load_on_start._M_payload.super__Optional_payload_base<bool> = SUB82((ulong)puVar4 >> 0x30,0);
    in_stack_fffffffffffff3bc = CONCAT13(bVar1,(int3)in_stack_fffffffffffff3bc);
  } while (bVar1);
  std::optional<bool>::optional(&local_b62);
  RemoveWallet((WalletContext *)in_stack_fffffffffffff3c0,
               (shared_ptr<wallet::CWallet> *)
               CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8),
               (optional<bool>)load_on_start._M_payload.super__Optional_payload_base<bool>);
  UniValue::~UniValue((UniValue *)in_stack_fffffffffffff398);
  JSONRPCRequest::~JSONRPCRequest((JSONRPCRequest *)in_stack_fffffffffffff398);
  CKey::~CKey((CKey *)in_stack_fffffffffffff398);
  UniValue::~UniValue((UniValue *)in_stack_fffffffffffff398);
  UniValue::~UniValue((UniValue *)in_stack_fffffffffffff398);
  WalletContext::~WalletContext((WalletContext *)in_stack_fffffffffffff398);
  std::shared_ptr<wallet::CWallet>::~shared_ptr
            ((shared_ptr<wallet::CWallet> *)in_stack_fffffffffffff398);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(importmulti_rescan, TestChain100Setup)
{
    // Cap last block file size, and mine new block in a new block file.
    CBlockIndex* oldTip = WITH_LOCK(Assert(m_node.chainman)->GetMutex(), return m_node.chainman->ActiveChain().Tip());
    WITH_LOCK(::cs_main, m_node.chainman->m_blockman.GetBlockFileInfo(oldTip->GetBlockPos().nFile)->nSize = MAX_BLOCKFILE_SIZE);
    CreateAndProcessBlock({}, GetScriptForRawPubKey(coinbaseKey.GetPubKey()));
    CBlockIndex* newTip = WITH_LOCK(Assert(m_node.chainman)->GetMutex(), return m_node.chainman->ActiveChain().Tip());

    // Prune the older block file.
    int file_number;
    {
        LOCK(cs_main);
        file_number = oldTip->GetBlockPos().nFile;
        Assert(m_node.chainman)->m_blockman.PruneOneBlockFile(file_number);
    }
    m_node.chainman->m_blockman.UnlinkPrunedFiles({file_number});

    // Verify importmulti RPC returns failure for a key whose creation time is
    // before the missing block, and success for a key whose creation time is
    // after.
    {
        const std::shared_ptr<CWallet> wallet = std::make_shared<CWallet>(m_node.chain.get(), "", CreateMockableWalletDatabase());
        wallet->SetupLegacyScriptPubKeyMan();
        WITH_LOCK(wallet->cs_wallet, wallet->SetLastBlockProcessed(newTip->nHeight, newTip->GetBlockHash()));
        WalletContext context;
        context.args = &m_args;
        AddWallet(context, wallet);
        UniValue keys;
        keys.setArray();
        UniValue key;
        key.setObject();
        key.pushKV("scriptPubKey", HexStr(GetScriptForRawPubKey(coinbaseKey.GetPubKey())));
        key.pushKV("timestamp", 0);
        key.pushKV("internal", UniValue(true));
        keys.push_back(key);
        key.clear();
        key.setObject();
        CKey futureKey = GenerateRandomKey();
        key.pushKV("scriptPubKey", HexStr(GetScriptForRawPubKey(futureKey.GetPubKey())));
        key.pushKV("timestamp", newTip->GetBlockTimeMax() + TIMESTAMP_WINDOW + 1);
        key.pushKV("internal", UniValue(true));
        keys.push_back(std::move(key));
        JSONRPCRequest request;
        request.context = &context;
        request.params.setArray();
        request.params.push_back(std::move(keys));

        UniValue response = importmulti().HandleRequest(request);
        BOOST_CHECK_EQUAL(response.write(),
            strprintf("[{\"success\":false,\"error\":{\"code\":-1,\"message\":\"Rescan failed for key with creation "
                      "timestamp %d. There was an error reading a block from time %d, which is after or within %d "
                      "seconds of key creation, and could contain transactions pertaining to the key. As a result, "
                      "transactions and coins using this key may not appear in the wallet. This error could be caused "
                      "by pruning or data corruption (see bitcoind log for details) and could be dealt with by "
                      "downloading and rescanning the relevant blocks (see -reindex option and rescanblockchain "
                      "RPC).\"}},{\"success\":true}]",
                              0, oldTip->GetBlockTimeMax(), TIMESTAMP_WINDOW));
        RemoveWallet(context, wallet, /* load_on_start= */ std::nullopt);
    }
}